

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
ktx::Reporter::warning<char_const(&)[175],std::__cxx11::string>
          (Reporter *this,char (*args) [175],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  pointer local_38;
  size_type sStack_30;
  
  local_38 = (this->commandName)._M_dataplus._M_p;
  sStack_30 = (this->commandName)._M_string_length;
  format_str.size_ = 0xc;
  format_str.data_ = "{} warning: ";
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
  args_00.desc_ = 0xd;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str,args_00);
  sVar2 = strlen(*args);
  local_38 = (args_1->_M_dataplus)._M_p;
  sStack_30 = args_1->_M_string_length;
  format_str_00.size_ = sVar2;
  format_str_00.data_ = *args;
  args_01.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_38;
  args_01.desc_ = 0xd;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_00,args_01);
  format_str_01.size_ = 1;
  format_str_01.data_ = "\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_38;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_01,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar1 << 0x40));
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }